

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::get_object_handle(void *ptr,type_info *type)

{
  void ***this;
  bool bVar1;
  internals *piVar2;
  pointer ppVar3;
  value_and_holder *pvVar4;
  value_and_holder vh;
  iterator __end3;
  iterator __begin3;
  values_and_holders *__range3;
  _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false> it;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  range;
  unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
  *instances;
  type_info *type_local;
  void *ptr_local;
  
  type_local = (type_info *)ptr;
  piVar2 = get_internals();
  range.second.
  super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
           &piVar2->registered_instances;
  _it = std::
        unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
        ::equal_range((unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
                       *)range.second.
                         super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                         ._M_cur,&type_local);
  __range3 = (values_and_holders *)
             it.
             super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
             ._M_cur;
  do {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                        *)&__range3,
                       (_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                        *)&range);
    if (!bVar1) {
      memset(&ptr_local,0,8);
      pybind11::handle::handle((handle *)&ptr_local);
      return (handle)(PyObject *)ptr_local;
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                           *)&__range3);
    values_and_holders::values_and_holders((values_and_holders *)&__begin3.curr.vh,ppVar3->second);
    this = &__begin3.curr.vh;
    values_and_holders::begin((iterator *)&__end3.curr.vh,(values_and_holders *)this);
    values_and_holders::end((iterator *)&vh.vh,(values_and_holders *)this);
    while (bVar1 = values_and_holders::iterator::operator!=
                             ((iterator *)&__end3.curr.vh,(iterator *)&vh.vh), bVar1) {
      pvVar4 = values_and_holders::iterator::operator*((iterator *)&__end3.curr.vh);
      vh.inst = (instance *)pvVar4->index;
      vh.index = (size_t)pvVar4->type;
      vh.type = (type_info *)pvVar4->vh;
      if ((type_info *)vh.index == type) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                               *)&__range3);
        pybind11::handle::handle((handle *)&ptr_local,&ppVar3->second->ob_base);
        return (handle)(PyObject *)ptr_local;
      }
      values_and_holders::iterator::operator++((iterator *)&__end3.curr.vh);
    }
    std::__detail::
    _Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>
                *)&__range3);
  } while( true );
}

Assistant:

PYBIND11_NOINLINE inline handle get_object_handle(const void *ptr, const detail::type_info *type ) {
    auto &instances = get_internals().registered_instances;
    auto range = instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        for (auto vh : values_and_holders(it->second)) {
            if (vh.type == type)
                return handle((PyObject *) it->second);
        }
    }
    return handle();
}